

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::DBTest_IterSingle_Test::TestBody(DBTest_IterSingle_Test *this)

{
  DB *pDVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  undefined4 extraout_var;
  AssertHelper local_420;
  Message local_418;
  string local_410;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_13;
  AssertHelper local_3d0;
  Message local_3c8;
  string local_3c0;
  undefined1 local_3a0 [8];
  AssertionResult gtest_ar_12;
  Message local_388;
  string local_380;
  undefined1 local_360 [8];
  AssertionResult gtest_ar_11;
  AssertHelper local_340;
  Message local_338;
  string local_330;
  undefined1 local_310 [8];
  AssertionResult gtest_ar_10;
  Message local_2f8;
  string local_2f0;
  undefined1 local_2d0 [8];
  AssertionResult gtest_ar_9;
  AssertHelper local_2b0;
  Message local_2a8;
  string local_2a0;
  undefined1 local_280 [8];
  AssertionResult gtest_ar_8;
  Message local_268;
  string local_260;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_7;
  Message local_228;
  string local_220;
  undefined1 local_200 [8];
  AssertionResult gtest_ar_6;
  Message local_1e8;
  string local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_5;
  Message local_1a8;
  string local_1a0;
  undefined1 local_180 [8];
  AssertionResult gtest_ar_4;
  Message local_168;
  string local_160;
  undefined1 local_140 [8];
  AssertionResult gtest_ar_3;
  Message local_128;
  string local_120;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_2;
  Message local_e8;
  string local_e0;
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Iterator *iter;
  AssertHelper local_90;
  Message local_88;
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50;
  undefined1 local_30 [24];
  AssertionResult gtest_ar;
  DBTest_IterSingle_Test *this_local;
  Iterator *iter_00;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  test::IsOK();
  testing::internal::MakePredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"a",&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"va",&local_79);
  DBTest::Put((DBTest *)local_30,(string *)this,&local_50);
  testing::internal::PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher>::operator()
            ((PredicateFormatterFromMatcher<leveldb::test::IsOKMatcher> *)(local_30 + 0x10),
             local_30 + 0xf,(Status *)"Put(\"a\", \"va\")");
  Status::~Status((Status *)local_30);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)(local_30 + 0x10));
  if (!bVar2) {
    testing::Message::Message(&local_88);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)(local_30 + 0x10));
    testing::internal::AssertHelper::AssertHelper
              (&local_90,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
               ,0x317,pcVar4);
    testing::internal::AssertHelper::operator=(&local_90,&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_90);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)(local_30 + 0x10));
  if (bVar2) {
    pDVar1 = (this->super_DBTest).db_;
    memset(&gtest_ar_1.message_,0,0x10);
    ReadOptions::ReadOptions((ReadOptions *)&gtest_ar_1.message_);
    iVar3 = (*pDVar1->_vptr_DB[6])(pDVar1,&gtest_ar_1.message_);
    iter_00 = (Iterator *)CONCAT44(extraout_var,iVar3);
    (*iter_00->_vptr_Iterator[3])();
    DBTest::IterStatus_abi_cxx11_(&local_e0,&this->super_DBTest,iter_00);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
              ((EqHelper *)local_c0,"IterStatus(iter)","\"a->va\"",&local_e0,(char (*) [6])"a->va");
    std::__cxx11::string::~string((string *)&local_e0);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
    if (!bVar2) {
      testing::Message::Message(&local_e8);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                 ,0x31b,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_e8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_e8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
    if (bVar2) {
      (*iter_00->_vptr_Iterator[6])();
      DBTest::IterStatus_abi_cxx11_(&local_120,&this->super_DBTest,iter_00);
      testing::internal::EqHelper::
      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                ((EqHelper *)local_100,"IterStatus(iter)","\"(invalid)\"",&local_120,
                 (char (*) [10])"(invalid)");
      std::__cxx11::string::~string((string *)&local_120);
      bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
      if (!bVar2) {
        testing::Message::Message(&local_128);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                   ,0x31d,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_128);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_128);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
      if (bVar2) {
        (*iter_00->_vptr_Iterator[3])();
        DBTest::IterStatus_abi_cxx11_(&local_160,&this->super_DBTest,iter_00);
        testing::internal::EqHelper::
        Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
                  ((EqHelper *)local_140,"IterStatus(iter)","\"a->va\"",&local_160,
                   (char (*) [6])"a->va");
        std::__cxx11::string::~string((string *)&local_160);
        bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
        if (!bVar2) {
          testing::Message::Message(&local_168);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                     ,799,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_168);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_168);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
        if (bVar2) {
          (*iter_00->_vptr_Iterator[7])();
          DBTest::IterStatus_abi_cxx11_(&local_1a0,&this->super_DBTest,iter_00);
          testing::internal::EqHelper::
          Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                    ((EqHelper *)local_180,"IterStatus(iter)","\"(invalid)\"",&local_1a0,
                     (char (*) [10])"(invalid)");
          std::__cxx11::string::~string((string *)&local_1a0);
          bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
          if (!bVar2) {
            testing::Message::Message(&local_1a8);
            pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_180);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                       ,0x321,pcVar4);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_1a8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_1a8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
          if (bVar2) {
            (*iter_00->_vptr_Iterator[4])();
            DBTest::IterStatus_abi_cxx11_(&local_1e0,&this->super_DBTest,iter_00);
            testing::internal::EqHelper::
            Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
                      ((EqHelper *)local_1c0,"IterStatus(iter)","\"a->va\"",&local_1e0,
                       (char (*) [6])"a->va");
            std::__cxx11::string::~string((string *)&local_1e0);
            bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
            if (!bVar2) {
              testing::Message::Message(&local_1e8);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                         ,0x324,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_1e8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_1e8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
            if (bVar2) {
              (*iter_00->_vptr_Iterator[6])();
              DBTest::IterStatus_abi_cxx11_(&local_220,&this->super_DBTest,iter_00);
              testing::internal::EqHelper::
              Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                        ((EqHelper *)local_200,"IterStatus(iter)","\"(invalid)\"",&local_220,
                         (char (*) [10])"(invalid)");
              std::__cxx11::string::~string((string *)&local_220);
              bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_200);
              if (!bVar2) {
                testing::Message::Message(&local_228);
                pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_200);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                           ,0x326,pcVar4);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_228);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_228);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_200);
              if (bVar2) {
                (*iter_00->_vptr_Iterator[4])();
                DBTest::IterStatus_abi_cxx11_(&local_260,&this->super_DBTest,iter_00);
                testing::internal::EqHelper::
                Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
                          ((EqHelper *)local_240,"IterStatus(iter)","\"a->va\"",&local_260,
                           (char (*) [6])"a->va");
                std::__cxx11::string::~string((string *)&local_260);
                bVar2 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_240);
                if (!bVar2) {
                  testing::Message::Message(&local_268);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                             ,0x328,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_268);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_268);
                }
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
                if (bVar2) {
                  (*iter_00->_vptr_Iterator[7])();
                  DBTest::IterStatus_abi_cxx11_(&local_2a0,&this->super_DBTest,iter_00);
                  testing::internal::EqHelper::
                  Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                            ((EqHelper *)local_280,"IterStatus(iter)","\"(invalid)\"",&local_2a0,
                             (char (*) [10])"(invalid)");
                  std::__cxx11::string::~string((string *)&local_2a0);
                  bVar2 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_280);
                  if (!bVar2) {
                    testing::Message::Message(&local_2a8);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_280)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              (&local_2b0,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                               ,0x32a,pcVar4);
                    testing::internal::AssertHelper::operator=(&local_2b0,&local_2a8);
                    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
                    testing::Message::~Message(&local_2a8);
                  }
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
                  if (bVar2) {
                    Slice::Slice((Slice *)&gtest_ar_9.message_,"");
                    (*iter_00->_vptr_Iterator[5])(iter_00,&gtest_ar_9.message_);
                    DBTest::IterStatus_abi_cxx11_(&local_2f0,&this->super_DBTest,iter_00);
                    testing::internal::EqHelper::
                    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
                              ((EqHelper *)local_2d0,"IterStatus(iter)","\"a->va\"",&local_2f0,
                               (char (*) [6])"a->va");
                    std::__cxx11::string::~string((string *)&local_2f0);
                    bVar2 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_2d0);
                    if (!bVar2) {
                      testing::Message::Message(&local_2f8);
                      pcVar4 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_2d0);
                      testing::internal::AssertHelper::AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                                 ,0x32d,pcVar4);
                      testing::internal::AssertHelper::operator=
                                ((AssertHelper *)&gtest_ar_10.message_,&local_2f8);
                      testing::internal::AssertHelper::~AssertHelper
                                ((AssertHelper *)&gtest_ar_10.message_);
                      testing::Message::~Message(&local_2f8);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d0);
                    if (bVar2) {
                      (*iter_00->_vptr_Iterator[6])();
                      DBTest::IterStatus_abi_cxx11_(&local_330,&this->super_DBTest,iter_00);
                      testing::internal::EqHelper::
                      Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                                ((EqHelper *)local_310,"IterStatus(iter)","\"(invalid)\"",&local_330
                                 ,(char (*) [10])"(invalid)");
                      std::__cxx11::string::~string((string *)&local_330);
                      bVar2 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_310);
                      if (!bVar2) {
                        testing::Message::Message(&local_338);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_310);
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_340,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                                   ,0x32f,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_340,&local_338);
                        testing::internal::AssertHelper::~AssertHelper(&local_340);
                        testing::Message::~Message(&local_338);
                      }
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_310);
                      if (bVar2) {
                        Slice::Slice((Slice *)&gtest_ar_11.message_,"a");
                        (*iter_00->_vptr_Iterator[5])(iter_00,&gtest_ar_11.message_);
                        DBTest::IterStatus_abi_cxx11_(&local_380,&this->super_DBTest,iter_00);
                        testing::internal::EqHelper::
                        Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[6],_nullptr>
                                  ((EqHelper *)local_360,"IterStatus(iter)","\"a->va\"",&local_380,
                                   (char (*) [6])"a->va");
                        std::__cxx11::string::~string((string *)&local_380);
                        bVar2 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_360);
                        if (!bVar2) {
                          testing::Message::Message(&local_388);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_360);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                                     ,0x332,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_12.message_,&local_388);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_12.message_);
                          testing::Message::~Message(&local_388);
                        }
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                        if (bVar2) {
                          (*iter_00->_vptr_Iterator[6])();
                          DBTest::IterStatus_abi_cxx11_(&local_3c0,&this->super_DBTest,iter_00);
                          testing::internal::EqHelper::
                          Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                                    ((EqHelper *)local_3a0,"IterStatus(iter)","\"(invalid)\"",
                                     &local_3c0,(char (*) [10])"(invalid)");
                          std::__cxx11::string::~string((string *)&local_3c0);
                          bVar2 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_3a0);
                          if (!bVar2) {
                            testing::Message::Message(&local_3c8);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_3a0);
                            testing::internal::AssertHelper::AssertHelper
                                      (&local_3d0,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                                       ,0x334,pcVar4);
                            testing::internal::AssertHelper::operator=(&local_3d0,&local_3c8);
                            testing::internal::AssertHelper::~AssertHelper(&local_3d0);
                            testing::Message::~Message(&local_3c8);
                          }
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a0);
                          if (bVar2) {
                            Slice::Slice((Slice *)&gtest_ar_13.message_,"b");
                            (*iter_00->_vptr_Iterator[5])(iter_00,&gtest_ar_13.message_);
                            DBTest::IterStatus_abi_cxx11_(&local_410,&this->super_DBTest,iter_00);
                            testing::internal::EqHelper::
                            Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_char[10],_nullptr>
                                      ((EqHelper *)local_3f0,"IterStatus(iter)","\"(invalid)\"",
                                       &local_410,(char (*) [10])"(invalid)");
                            std::__cxx11::string::~string((string *)&local_410);
                            bVar2 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_3f0);
                            if (!bVar2) {
                              testing::Message::Message(&local_418);
                              pcVar4 = testing::AssertionResult::failure_message
                                                 ((AssertionResult *)local_3f0);
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_420,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_test.cc"
                                         ,0x337,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_420,&local_418);
                              testing::internal::AssertHelper::~AssertHelper(&local_420);
                              testing::Message::~Message(&local_418);
                            }
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0)
                            ;
                            if ((bVar2) && (iter_00 != (Iterator *)0x0)) {
                              (*iter_00->_vptr_Iterator[1])();
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST_F(DBTest, IterSingle) {
  ASSERT_LEVELDB_OK(Put("a", "va"));
  Iterator* iter = db_->NewIterator(ReadOptions());

  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToFirst();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");
  iter->SeekToLast();
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Prev();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("a");
  ASSERT_EQ(IterStatus(iter), "a->va");
  iter->Next();
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  iter->Seek("b");
  ASSERT_EQ(IterStatus(iter), "(invalid)");

  delete iter;
}